

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScapeGoatTree.cpp
# Opt level: O1

int __thiscall ScapeGoatTree::addWithDepth(ScapeGoatTree *this,Node *node)

{
  int iVar1;
  Node *pNVar2;
  int iVar3;
  Node *pNVar4;
  bool bVar5;
  Node *pNVar6;
  
  pNVar4 = this->root;
  if (pNVar4 == (Node *)0x0) {
    this->root = node;
    iVar3 = 0;
  }
  else {
    iVar1 = node->value;
    bVar5 = false;
    iVar3 = 0;
    do {
      if (iVar1 < pNVar4->value) {
        pNVar2 = pNVar4->leftChild;
        if (pNVar4->leftChild == (Node *)0x0) {
          pNVar6 = (Node *)&pNVar4->leftChild;
LAB_001069cd:
          pNVar6->rightChild = node;
          node->parent = pNVar4;
          bVar5 = true;
          pNVar2 = pNVar4;
        }
      }
      else {
        if (iVar1 <= pNVar4->value) {
          return -1;
        }
        pNVar2 = pNVar4->rightChild;
        pNVar6 = pNVar4;
        if (pNVar4->rightChild == (Node *)0x0) goto LAB_001069cd;
      }
      pNVar4 = pNVar2;
      iVar3 = iVar3 + 1;
    } while (!bVar5);
  }
  this->n = this->n + 1;
  this->q = this->q + 1;
  return iVar3;
}

Assistant:

int ScapeGoatTree::addWithDepth(Node *node) {
    Node *w = root;
    if (w == nullptr) {
        root = node;
        n++;
        q++;
        return 0;
    }
    bool done = false;
    int d = 0;
    do {
        if (node->value < w->value) {
            if (w->leftChild == nullptr) {
                w->leftChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->leftChild;
            }
        } else if (node->value > w->value) {
            if (w->rightChild == nullptr) {
                w->rightChild = node;
                node->parent = w;
                done = true;
            } else {
                w = w->rightChild;
            }
        } else {
            return -1;
        }
        d++;
    } while (!done);

    n++;
    q++;
    return d;
}